

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  Mat *this_00;
  size_t sVar5;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  int j_1;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int j_2;
  uint _w;
  long lVar21;
  long lVar22;
  long lVar23;
  void *pvVar24;
  long lVar25;
  void *pvVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  void *pvVar34;
  long lVar35;
  long lVar36;
  void *pvVar37;
  void *pvVar38;
  void *pvVar39;
  bool bVar40;
  float sum;
  float fVar41;
  float fVar42;
  float fVar43;
  ulong local_2b8;
  long local_2b0;
  void *local_2a0;
  void *local_298;
  void *local_290;
  void *local_288;
  Mat local_1b8;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar40 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4 == 0x48;
  lVar35 = 0x48;
  if (bVar40) {
    lVar35 = 0;
  }
  lVar14 = 0x90;
  if (bVar40) {
    lVar14 = 0;
  }
  uVar1 = pMVar4->h;
  uVar20 = (ulong)uVar1;
  _w = this->embed_dim / this->num_head;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->embed_dim,uVar1,4,opt->blob_allocator);
  iVar13 = -1;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,_w,uVar1,this->num_head,4,opt->workspace_allocator);
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    Mat::create(&local_c8,_w,uVar1,this->num_head,4,opt->workspace_allocator);
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Mat::create(&local_118,uVar1,_w,this->num_head,4,opt->workspace_allocator);
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,uVar1,uVar1,this->num_head,4,opt->workspace_allocator);
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,_w,this->num_head,uVar1,4,opt->workspace_allocator);
    pvVar39 = local_78.data;
    pvVar24 = local_c8.data;
    pvVar9 = local_118.data;
    pvVar8 = local_168.data;
    pvVar7 = local_1b8.data;
    iVar13 = this->num_head;
    if (0 < (long)iVar13) {
      lVar23 = (long)(int)_w;
      lVar15 = local_78.cstep * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      lVar27 = (long)local_78.w * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      uVar31 = (ulong)_w;
      lVar16 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      lVar32 = (long)local_c8.w * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      lVar17 = local_118.cstep * CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
      lVar29 = (long)local_118.w * CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize)
      ;
      lVar12 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
      lVar18 = local_168.cstep * lVar12;
      lVar19 = (long)local_168.w;
      lVar25 = (long)local_1b8.w;
      lVar11 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
      lVar30 = local_1b8.cstep * lVar11;
      lVar36 = (long)local_168.w;
      local_2b0 = 0;
      local_288 = local_118.data;
      local_2a0 = local_168.data;
      local_290 = local_78.data;
      local_298 = local_c8.data;
      local_2b8 = 0;
      do {
        if (0 < (int)uVar1) {
          iVar2 = this->embed_dim;
          pvVar34 = (this->q_bias_data).data;
          pvVar26 = (this->q_weight_data).data;
          uVar28 = 0;
          do {
            if (0 < (int)_w) {
              iVar3 = pMVar4->w;
              sVar5 = pMVar4->elemsize;
              pvVar38 = pMVar4->data;
              uVar33 = 0;
              pvVar37 = (void *)(local_2b0 * iVar2 + (long)pvVar26);
              do {
                fVar41 = *(float *)((long)pvVar34 + (local_2b8 * lVar23 + uVar33) * 4);
                if (0 < iVar2) {
                  lVar21 = 0;
                  do {
                    fVar41 = fVar41 + *(float *)((long)pvVar37 + lVar21 * 4) *
                                      *(float *)((long)pvVar38 +
                                                lVar21 * 4 + sVar5 * uVar28 * (long)iVar3);
                    lVar21 = lVar21 + 1;
                  } while (iVar2 != (int)lVar21);
                }
                *(float *)((long)pvVar39 + uVar33 * 4 + lVar27 * uVar28 + lVar15 * local_2b8) =
                     fVar41 * (1.0 / SQRT((float)(int)_w));
                uVar33 = uVar33 + 1;
                pvVar37 = (void *)((long)pvVar37 + (long)iVar2 * 4);
              } while (uVar33 != uVar31);
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 != uVar20);
          if (0 < (int)uVar1) {
            iVar2 = this->embed_dim;
            pvVar34 = (this->k_bias_data).data;
            pvVar26 = (this->k_weight_data).data;
            uVar28 = 0;
            do {
              if (0 < (int)_w) {
                iVar3 = *(int *)((long)&pMVar4->w + lVar35);
                lVar21 = *(long *)((long)&pMVar4->elemsize + lVar35);
                lVar6 = *(long *)((long)&pMVar4->data + lVar35);
                uVar33 = 0;
                pvVar38 = (void *)(local_2b0 * iVar2 + (long)pvVar26);
                do {
                  fVar41 = *(float *)((long)pvVar34 + (local_2b8 * lVar23 + uVar33) * 4);
                  if (0 < iVar2) {
                    lVar22 = 0;
                    do {
                      fVar41 = fVar41 + *(float *)((long)pvVar38 + lVar22 * 4) *
                                        *(float *)(lVar21 * uVar28 * (long)iVar3 + lVar6 +
                                                  lVar22 * 4);
                      lVar22 = lVar22 + 1;
                    } while (iVar2 != (int)lVar22);
                  }
                  *(float *)((long)pvVar24 + uVar33 * 4 + lVar32 * uVar28 + lVar16 * local_2b8) =
                       fVar41;
                  uVar33 = uVar33 + 1;
                  pvVar38 = (void *)((long)pvVar38 + (long)iVar2 * 4);
                } while (uVar33 != uVar31);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != uVar20);
          }
        }
        if (0 < (int)_w) {
          iVar2 = this->embed_dim;
          pvVar34 = (this->v_bias_data).data;
          pvVar26 = (void *)(local_2b0 * iVar2 + (long)(this->v_weight_data).data);
          uVar28 = 0;
          do {
            if (0 < (int)uVar1) {
              lVar21 = *(long *)((long)&pMVar4->data + lVar14);
              iVar3 = *(int *)((long)&pMVar4->w + lVar14);
              lVar6 = *(long *)((long)&pMVar4->elemsize + lVar14);
              uVar33 = 0;
              do {
                fVar41 = *(float *)((long)pvVar34 + (local_2b8 * lVar23 + uVar28) * 4);
                if (0 < iVar2) {
                  lVar22 = 0;
                  do {
                    fVar41 = fVar41 + *(float *)((long)pvVar26 + lVar22 * 4) *
                                      *(float *)(lVar21 + lVar22 * 4);
                    lVar22 = lVar22 + 1;
                  } while (iVar2 != (int)lVar22);
                }
                *(float *)((long)pvVar9 + uVar33 * 4 + lVar29 * uVar28 + lVar17 * local_2b8) =
                     fVar41;
                uVar33 = uVar33 + 1;
                lVar21 = lVar21 + iVar3 * lVar6;
              } while (uVar33 != uVar20);
            }
            uVar28 = uVar28 + 1;
            pvVar26 = (void *)((long)pvVar26 + (long)iVar2 * 4);
          } while (uVar28 != uVar31);
        }
        pvVar34 = (void *)(lVar18 * local_2b8 + (long)pvVar8);
        if (0 < (int)uVar1) {
          uVar28 = 0;
          pvVar26 = local_290;
          do {
            uVar33 = 0;
            pvVar38 = local_298;
            do {
              fVar41 = 0.0;
              if (0 < (int)_w) {
                lVar21 = 0;
                do {
                  fVar41 = fVar41 + *(float *)((long)pvVar38 + lVar21 * 4) *
                                    *(float *)((long)pvVar26 + lVar21 * 4);
                  lVar21 = lVar21 + 1;
                } while (_w != (uint)lVar21);
              }
              *(float *)((long)pvVar34 + uVar33 * 4 + lVar19 * lVar12 * uVar28) = fVar41;
              uVar33 = uVar33 + 1;
              pvVar38 = (void *)((long)pvVar38 + lVar32);
            } while (uVar33 != uVar20);
            uVar28 = uVar28 + 1;
            pvVar26 = (void *)((long)pvVar26 + lVar27);
          } while (uVar28 != uVar20);
          if (0 < (int)uVar1) {
            uVar28 = 0;
            pvVar26 = local_2a0;
            do {
              uVar33 = 0;
              fVar41 = -3.4028235e+38;
              do {
                fVar43 = *(float *)((long)pvVar26 + uVar33 * 4);
                if (fVar41 <= fVar43) {
                  fVar41 = fVar43;
                }
                uVar33 = uVar33 + 1;
              } while (uVar20 != uVar33);
              fVar43 = 0.0;
              uVar33 = 0;
              do {
                fVar42 = expf(*(float *)((long)pvVar26 + uVar33 * 4) - fVar41);
                *(float *)((long)pvVar26 + uVar33 * 4) = fVar42;
                fVar43 = fVar43 + fVar42;
                uVar33 = uVar33 + 1;
              } while (uVar20 != uVar33);
              uVar33 = 0;
              do {
                *(float *)((long)pvVar26 + uVar33 * 4) =
                     *(float *)((long)pvVar26 + uVar33 * 4) * (1.0 / fVar43);
                uVar33 = uVar33 + 1;
              } while (uVar20 != uVar33);
              uVar28 = uVar28 + 1;
              pvVar26 = (void *)((long)pvVar26 + lVar19 * lVar12);
            } while (uVar28 != uVar20);
          }
        }
        if (0 < (int)uVar1) {
          uVar28 = 0;
          do {
            if (0 < (int)_w) {
              uVar33 = 0;
              pvVar26 = local_288;
              do {
                fVar41 = 0.0;
                lVar21 = 0;
                do {
                  fVar41 = fVar41 + *(float *)((long)pvVar26 + lVar21 * 4) *
                                    *(float *)((long)pvVar34 + lVar21 * 4);
                  lVar21 = lVar21 + 1;
                } while (uVar1 != (uint)lVar21);
                *(float *)((long)pvVar7 + uVar33 * 4 + lVar30 * uVar28 + local_2b8 * lVar25 * lVar11
                          ) = fVar41;
                uVar33 = uVar33 + 1;
                pvVar26 = (void *)((long)pvVar26 + lVar29);
              } while (uVar33 != uVar31);
            }
            uVar28 = uVar28 + 1;
            pvVar34 = (void *)((long)pvVar34 + lVar36 * lVar12);
          } while (uVar28 != uVar20);
        }
        local_2b8 = local_2b8 + 1;
        local_2b0 = local_2b0 + lVar23 * 4;
        local_298 = (void *)((long)local_298 + lVar16);
        local_290 = (void *)((long)local_290 + lVar15);
        local_2a0 = (void *)((long)local_2a0 + lVar18);
        local_288 = (void *)((long)local_288 + lVar17);
      } while (local_2b8 < (ulong)(long)iVar13);
    }
    if (0 < (int)uVar1) {
      pvVar7 = this_00->data;
      iVar13 = this_00->w;
      sVar5 = this_00->elemsize;
      uVar1 = this->embed_dim;
      pvVar8 = (this->out_weight_data).data;
      pvVar9 = (this->out_bias_data).data;
      uVar31 = 0;
      pvVar24 = local_1b8.data;
      do {
        if (0 < (int)uVar1) {
          uVar28 = 0;
          pvVar39 = pvVar8;
          do {
            fVar41 = *(float *)((long)pvVar9 + uVar28 * 4);
            lVar35 = 0;
            do {
              fVar41 = fVar41 + *(float *)((long)pvVar39 + lVar35 * 4) *
                                *(float *)((long)pvVar24 + lVar35 * 4);
              lVar35 = lVar35 + 1;
            } while (uVar1 != (uint)lVar35);
            *(float *)((long)pvVar7 + uVar28 * 4 + (long)iVar13 * sVar5 * uVar31) = fVar41;
            uVar28 = uVar28 + 1;
            pvVar39 = (void *)((long)pvVar39 + (long)(int)uVar1 * 4);
          } while (uVar28 != uVar1);
        }
        uVar31 = uVar31 + 1;
        pvVar24 = (void *)((long)pvVar24 +
                          local_1b8.cstep *
                          CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize));
      } while (uVar31 != uVar20);
    }
    piVar10 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[1];
    const Mat& v_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[2];

    const int seqlen = q_blob.h;
    const int embed_dim_per_head = embed_dim / num_head;

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xv(seqlen, embed_dim_per_head, num_head, 4u, opt.workspace_allocator);

    Mat xqk(seqlen, seqlen, num_head, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_head, seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrt(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_head; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + embed_dim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, seqlen)
        // xk  (embed_dim_per_head, seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] = (float)(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (seqlen, seqlen)
        // xv  (seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_head, seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}